

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVaction INT_EVassoc_terminal_action
                   (CManager_conflict cm,EVstone stone_num,FMStructDescList format_list,
                   EVSimpleHandlerFunc handler,void *client_data)

{
  void **ppvVar1;
  undefined8 *puVar2;
  attr_list *pp_Var3;
  uint uVar4;
  event_path_data evp;
  response_cache_element *prVar5;
  int iVar6;
  stone_type stone;
  long lVar7;
  _proto_action *p_Var8;
  long lVar9;
  response_cache_element *prVar10;
  FMFormat *pp_Var11;
  FMFormat p_Var12;
  encode_state eVar13;
  FILE *__stream;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_num);
  iVar6 = stone->proto_action_count;
  lVar7 = (long)iVar6;
  p_Var8 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar7 * 0x60 + 0x60);
  stone->proto_actions = p_Var8;
  *(undefined8 *)(p_Var8 + lVar7) = 0;
  p_Var8[lVar7].input_format_requirements = (FMStructDescList)0x0;
  p_Var8[lVar7].matching_reference_formats = (FMFormat *)0x0;
  (((anon_union_48_6_c1ce387a_for_o *)(&p_Var8[lVar7].matching_reference_formats + 1))->term).
  handler = (EVSimpleHandlerFunc)0x0;
  ppvVar1 = &p_Var8[lVar7].o.term.client_data;
  *ppvVar1 = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  puVar2 = (undefined8 *)((long)&p_Var8[lVar7].o + 0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  pp_Var3 = &p_Var8[lVar7].o.bri.remote_contact;
  *pp_Var3 = (attr_list)0x0;
  pp_Var3[1] = (attr_list)0x0;
  p_Var8[lVar7].attrs = (attr_list)0x0;
  (&p_Var8[lVar7].attrs)[1] = (attr_list)0x0;
  p_Var8 = stone->proto_actions;
  p_Var8[lVar7].input_format_requirements = format_list;
  p_Var8[lVar7].action_type = Action_Terminal;
  p_Var8[lVar7].o.term.handler = handler;
  stone->proto_actions[lVar7].o.term.client_data = client_data;
  stone->proto_actions[lVar7].matching_reference_formats = (FMFormat *)0x0;
  uVar4 = stone->response_cache_count;
  lVar9 = (long)(int)uVar4;
  prVar10 = (response_cache_element *)INT_CMrealloc(stone->response_cache,lVar9 * 0x30 + 0x30);
  stone->response_cache = prVar10;
  prVar5 = prVar10 + lVar9;
  prVar5->reference_format = (FMFormat)0x0;
  prVar5->stage = Immediate;
  prVar5->action_type = Action_NoAction;
  prVar5 = prVar10 + lVar9;
  prVar5->proto_action_id = 0;
  prVar5->requires_decoded = 0;
  (((anon_union_24_3_3bd03a9c_for_o *)(&prVar5->proto_action_id + 2))->decode).decode_format =
       (FFSTypeHandle)0x0;
  pp_Var11 = &prVar10[lVar9].o.decode.target_reference_format;
  *pp_Var11 = (FMFormat)0x0;
  pp_Var11[1] = (FMFormat)0x0;
  p_Var8 = stone->proto_actions;
  if (format_list == (FMStructDescList)0x0) {
    p_Var8[lVar7].data_state = Requires_Contig_Encoded;
    stone->default_action = uVar4;
    eVar13 = Requires_Contig_Encoded;
  }
  else {
    p_Var8[lVar7].data_state = Requires_Decoded;
    pp_Var11 = (FMFormat *)INT_CMmalloc(0x10);
    stone->proto_actions[lVar7].matching_reference_formats = pp_Var11;
    p_Var12 = EVregister_format_set(cm,format_list);
    *stone->proto_actions[lVar7].matching_reference_formats = p_Var12;
    stone->proto_actions[lVar7].matching_reference_formats[1] = (FMFormat)0x0;
    p_Var8 = stone->proto_actions;
    eVar13 = p_Var8[lVar7].data_state;
  }
  prVar5 = stone->response_cache;
  prVar5[lVar9].action_type = Action_Terminal;
  prVar5[lVar9].requires_decoded = eVar13;
  if (p_Var8[lVar7].matching_reference_formats == (FMFormat *)0x0) {
    p_Var12 = (FMFormat)0x0;
  }
  else {
    p_Var12 = *p_Var8[lVar7].matching_reference_formats;
  }
  prVar5[lVar9].reference_format = p_Var12;
  prVar5[lVar9].proto_action_id = iVar6;
  stone->proto_action_count = stone->proto_action_count + 1;
  __stream = (FILE *)cm->CMTrace_file;
  if (__stream == (FILE *)0x0) {
    iVar6 = CMtrace_init(cm,EVerbose);
    if (iVar6 == 0) {
      return uVar4;
    }
    __stream = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[10] == 0) {
    return uVar4;
  }
  fprintf(__stream,"Adding Terminal action %d to ",(ulong)uVar4);
  fprint_stone_identifier(cm->CMTrace_file,evp,stone_num);
  fwrite("\nStone dump->\n",0xe,1,(FILE *)cm->CMTrace_file);
  fdump_stone(cm->CMTrace_file,stone);
  return uVar4;
}

Assistant:

EVaction
INT_EVassoc_terminal_action(CManager cm, EVstone stone_num, 
			    FMStructDescList format_list, EVSimpleHandlerFunc handler,
			    void *client_data)
{
    event_path_data evp = cm->evp;
    int action_num;
    stone_type stone;
    int proto_action_num;

    stone = stone_struct(evp, stone_num);
    proto_action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (proto_action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[proto_action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[proto_action_num].input_format_requirements =
	format_list;
    stone->proto_actions[proto_action_num].action_type = Action_Terminal;
    stone->proto_actions[proto_action_num].o.term.handler = handler;
    stone->proto_actions[proto_action_num].o.term.client_data = client_data;
    stone->proto_actions[proto_action_num].matching_reference_formats = NULL;
    action_num = stone->response_cache_count;
    stone->response_cache = realloc(stone->response_cache, (action_num + 1) * 
				   sizeof(stone->response_cache[0]));
    memset(&stone->response_cache[action_num], 0, sizeof(stone->response_cache[0]));
    if (format_list != NULL) {
	stone->proto_actions[proto_action_num].data_state = Requires_Decoded;
	stone->proto_actions[proto_action_num].matching_reference_formats = 
	    malloc(2*sizeof(FMFormat));
	stone->proto_actions[proto_action_num].matching_reference_formats[0] = 
	    EVregister_format_set(cm, format_list);
	stone->proto_actions[proto_action_num].matching_reference_formats[1] = NULL;
    } else {
	stone->proto_actions[proto_action_num].data_state = Requires_Contig_Encoded;
	stone->default_action = action_num;
    }
    stone->response_cache[action_num].action_type = Action_Terminal;
    stone->response_cache[action_num].requires_decoded =
	stone->proto_actions[proto_action_num].data_state;
    if (stone->proto_actions[proto_action_num].matching_reference_formats) {
	stone->response_cache[action_num].reference_format = 
	    stone->proto_actions[proto_action_num].matching_reference_formats[0];
    } else {
	stone->response_cache[action_num].reference_format = NULL;
    }
    stone->response_cache[action_num].proto_action_id = proto_action_num;
    stone->proto_action_count++;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Terminal action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, "\nStone dump->\n");
	fdump_stone(cm->CMTrace_file, stone);
    }
    return action_num;
}